

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

Gia_Man_t * Gia_ManCheckFalse(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  ulong uVar4;
  Gia_Man_t *p_02;
  int iVar5;
  int v;
  long lVar6;
  bool bVar7;
  uint local_4c;
  
  p_00 = Gia_ManDup(p);
  iVar5 = p_00->vCos->nSize;
  p_01 = Vec_IntAlloc(iVar5);
  p_01->nSize = iVar5;
  memset(p_01->pArray,0,(long)iVar5 << 2);
  local_4c = 0;
  iVar5 = 0;
  do {
    iVar1 = Gia_ManLevelNum(p_00);
    iVar3 = iVar5;
    for (lVar6 = 0; lVar6 < p_00->vCos->nSize; lVar6 = lVar6 + 1) {
      v = (int)lVar6;
      pObj = Gia_ManCo(p_00,v);
      if (pObj == (Gia_Obj_t *)0x0) break;
      uVar4 = (ulong)((uint)*(undefined8 *)pObj & 0x1fffffff);
      if ((~*(uint *)(pObj + -uVar4) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pObj + -uVar4)) {
        iVar2 = Gia_ObjLevel(p_00,pObj + -uVar4);
        if (iVar1 - nSlackMax <= iVar2) {
          iVar2 = Vec_IntEntry(p_01,v);
          if (iVar2 == 0) {
            local_4c = local_4c + 1;
            iVar2 = Gia_ObjFaninId0p(p_00,pObj);
            p_02 = Gia_ManCheckOne(p_00,v,iVar2,nTimeOut,fVerbose,fVeryVerbose);
            if (p_02 == (Gia_Man_t *)0x0) {
              if (p_01->nSize <= lVar6) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              p_01->pArray[lVar6] = 1;
            }
            else {
              iVar3 = iVar3 + 1;
              Gia_ManStop(p_00);
              iVar1 = Gia_ManLevelNum(p_02);
              p_00 = p_02;
            }
          }
        }
      }
    }
    bVar7 = iVar5 == iVar3;
    iVar5 = iVar3;
    if (bVar7) {
      printf("Performed %d attempts and %d changes.\n",(ulong)local_4c);
      Vec_IntFree(p_01);
      return p_00;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    Vec_Int_t * vTried;
//    srand( 111 );
    p = Gia_ManDup( p );
    vTried = Vec_IntStart( Gia_ManCoNum(p) );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachCo( p, pObj, i )
        {
            if ( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                continue;
            if ( Gia_ObjLevel(p, Gia_ObjFanin0(pObj)) < LevelMax - nSlackMax )
                continue;
            if ( Vec_IntEntry( vTried, i ) )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, i, Gia_ObjFaninId0p(p, pObj), nTimeOut, fVerbose, fVeryVerbose );
/*
            if ( i != 126 && pNew )
            {
                Gia_ManStop( pNew );
                pNew = NULL;
            }
*/
            if ( pNew == NULL )
            {
                Vec_IntWriteEntry( vTried, i, 1 );
                continue;
            }
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    Vec_IntFree( vTried );
    return p;
}